

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O2

map<long_long,_QPDFObjectHandle,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_QPDFObjectHandle>_>_>
* __thiscall
QPDFNumberTreeObjectHelper::getAsMap
          (map<long_long,_QPDFObjectHandle,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_QPDFObjectHandle>_>_>
           *__return_storage_ptr__,QPDFNumberTreeObjectHelper *this)

{
  _Rb_tree_header *p_Var1;
  iterator local_70;
  iterator local_40;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  begin(&local_40,this);
  end(&local_70,this);
  std::
  map<long_long,_QPDFObjectHandle,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_QPDFObjectHandle>_>_>
  ::insert<QPDFNumberTreeObjectHelper::iterator>(__return_storage_ptr__,&local_40,&local_70);
  iterator::~iterator(&local_70);
  iterator::~iterator(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::map<QPDFNumberTreeObjectHelper::numtree_number, QPDFObjectHandle>
QPDFNumberTreeObjectHelper::getAsMap() const
{
    std::map<numtree_number, QPDFObjectHandle> result;
    result.insert(begin(), end());
    return result;
}